

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void report(basic_ostream<char,_std::char_traits<char>_> *stream,NodeList *points)

{
  pointer ppNVar1;
  ostream *poVar2;
  pointer ppNVar3;
  
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::operator<<(poVar2," ");
  ppNVar1 = (points->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar3 = (points->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppNVar3 != ppNVar1; ppNVar3 = ppNVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
    std::operator<<(poVar2," ");
  }
  std::endl<char,std::char_traits<char>>(stream);
  return;
}

Assistant:

void report(std::basic_ostream<char>& stream, NodeList& points) {
    stream << points.size() << " ";
    for (Node* n : points) {
        stream << n->id << " ";
    }
    stream << std::endl;
}